

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSynchronizationTests.cpp
# Opt level: O2

void __thiscall
deqp::gles31::Functional::anon_unknown_1::InterInvocationTestCase::InterInvocationTestCase
          (InterInvocationTestCase *this,Context *context,char *name,char *desc,StorageType storage,
          int flags)

{
  byte bVar1;
  
  gles31::TestCase::TestCase(&this->super_TestCase,context,name,desc);
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__InterInvocationTestCase_01e4db60;
  this->m_storage = storage;
  bVar1 = (byte)flags;
  this->m_useAtomic = (bool)(bVar1 & 1);
  this->m_aliasingStorages = (bool)(bVar1 >> 1 & 1);
  this->m_syncWithGroup = (bool)(bVar1 >> 2 & 1);
  this->m_workWidth = 0x100;
  this->m_workHeight = 0x100;
  this->m_localWidth = 0x10;
  this->m_localHeight = 8;
  this->m_elementsPerInvocation = 8;
  this->m_storageBuf = 0;
  this->m_storageTex = 0;
  *(undefined8 *)&this->m_resultBuf = 0;
  *(undefined4 *)((long)&this->m_program + 4) = 0;
  return;
}

Assistant:

InterInvocationTestCase::InterInvocationTestCase (Context& context, const char* name, const char* desc, StorageType storage, int flags)
	: TestCase					(context, name, desc)
	, m_storage					(storage)
	, m_useAtomic				((flags & FLAG_ATOMIC) != 0)
	, m_aliasingStorages		((flags & FLAG_ALIASING_STORAGES) != 0)
	, m_syncWithGroup			((flags & FLAG_IN_GROUP) != 0)
	, m_workWidth				(256)
	, m_workHeight				(256)
	, m_localWidth				(16)
	, m_localHeight				(8)
	, m_elementsPerInvocation	(8)
	, m_storageBuf				(0)
	, m_storageTex				(0)
	, m_resultBuf				(0)
	, m_program					(DE_NULL)
{
	DE_ASSERT(m_storage < STORAGE_LAST);
	DE_ASSERT(m_localWidth*m_localHeight <= 128); // minimum MAX_COMPUTE_WORK_GROUP_INVOCATIONS value
}